

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argvParser.cpp
# Opt level: O2

bool __thiscall argvParser::analyzeConfigFile(argvParser *this,string *fileName)

{
  long lVar1;
  undefined8 this_00;
  bool bVar2;
  bool bVar3;
  configFileReader *this_01;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *this_02;
  reference pvVar4;
  ulong uVar5;
  int y;
  ulong __n;
  char *pcStack_b0;
  string local_a8;
  string local_88;
  undefined1 local_68 [8];
  string param;
  allocator local_31;
  
  pcStack_b0 = (char *)0x106eb5;
  this_01 = (configFileReader *)operator_new(0x80);
  pcStack_b0 = (char *)0x106ec4;
  std::__cxx11::string::string((string *)&local_88,(string *)fileName);
  pcStack_b0 = (char *)0x106ed0;
  configFileReader::configFileReader(this_01,&local_88);
  pcStack_b0 = (char *)0x106ed9;
  std::__cxx11::string::~string((string *)&local_88);
  pcStack_b0 = (char *)0x106eef;
  std::__cxx11::string::string((string *)&local_a8,(string *)&this->commentToken);
  pcStack_b0 = (char *)0x106efa;
  configFileReader::setCommentChar(this_01,&local_a8);
  pcStack_b0 = (char *)0x106f06;
  std::__cxx11::string::~string((string *)&local_a8);
  pcStack_b0 = (char *)0x106f0e;
  bVar2 = configFileReader::isEOF(this_01);
  if (bVar2) {
    pcStack_b0 = (char *)0x106f1d;
    configFileReader::~configFileReader(this_01);
    pcStack_b0 = (char *)0x106f25;
    operator_delete(this_01);
  }
  else {
    pcStack_b0 = (char *)0x106f32;
    this_02 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
              operator_new(0x18);
    *(undefined8 *)this_02 = 0;
    *(undefined8 *)(this_02 + 8) = 0;
    *(undefined8 *)(this_02 + 0x10) = 0;
    pcStack_b0 = (char *)0x106f54;
    std::__cxx11::string::string((string *)local_68,"program Name",&local_31);
    pcStack_b0 = (char *)0x106f64;
    param.field_2._8_8_ = this;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              (this_02,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68
              );
    while( true ) {
      pcStack_b0 = (char *)0x106f70;
      std::__cxx11::string::~string((string *)local_68);
      pcStack_b0 = (char *)0x106f78;
      bVar3 = configFileReader::isEOF(this_01);
      if (bVar3) break;
      pcStack_b0 = (char *)0x106f87;
      configFileReader::readUntilNextSeparator_abi_cxx11_((string *)local_68,this_01);
      pcStack_b0 = (char *)0x106f92;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)this_02,(string *)local_68);
    }
    lVar1 = -((*(long *)(this_02 + 8) - *(long *)this_02 >> 2) + 0xfU & 0xfffffffffffffff0);
    for (__n = 0; this_00 = param.field_2._8_8_,
        uVar5 = *(long *)(this_02 + 8) - *(long *)this_02 >> 5, __n < uVar5; __n = __n + 1) {
      *(undefined8 *)((long)&pcStack_b0 + lVar1) = 0x106fd6;
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)this_02,__n);
      ((char **)((long)&local_a8 + lVar1))[__n] = (pvVar4->_M_dataplus)._M_p;
    }
    *(undefined8 *)((long)&pcStack_b0 + lVar1) = 0x106fef;
    analyseArgv((argvParser *)this_00,(int)uVar5,(char **)((long)&local_a8 + lVar1));
    *(undefined8 *)((long)&pcStack_b0 + lVar1) = 0x106ff7;
    configFileReader::~configFileReader(this_01);
    *(undefined8 *)((long)&pcStack_b0 + lVar1) = 0x106fff;
    operator_delete(this_01);
  }
  return !bVar2;
}

Assistant:

bool argvParser::analyzeConfigFile(string fileName) {
    configFileReader *reader = new configFileReader(fileName);
    reader->setCommentChar(commentToken);
    if (!reader->isEOF()) {
        vector<string> *arg = new vector<string>();
        arg->push_back("program Name");
        while (!reader->isEOF()) {
            string param = reader->readUntilNextSeparator();
            arg->push_back(param);
        }
        char *buff[arg->size()];
        for (int y = 0; y < arg->size(); y++) {
            buff[y] = const_cast<char *>(arg->at(y).c_str());
        }
        analyseArgv(arg->size(), buff);
        delete reader;
    } else {
        delete reader;
        return false;
    }
    return true;
}